

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OCTET_STRING.c
# Opt level: O2

void OCTET_STRING_free(asn_TYPE_descriptor_t *td,void *sptr,int contents_only)

{
  int iVar1;
  undefined8 *__ptr;
  void *__ptr_00;
  asn_OCTET_STRING_specifics_t *paVar2;
  
  if (sptr != (void *)0x0 && td != (asn_TYPE_descriptor_t *)0x0) {
    paVar2 = &asn_DEF_OCTET_STRING_specs;
    if ((asn_OCTET_STRING_specifics_t *)td->specifics != (asn_OCTET_STRING_specifics_t *)0x0) {
      paVar2 = (asn_OCTET_STRING_specifics_t *)td->specifics;
    }
    iVar1 = paVar2->ctx_offset;
    if (*sptr != (void *)0x0) {
      free(*sptr);
      *(undefined8 *)sptr = 0;
    }
    __ptr = *(undefined8 **)((long)sptr + (long)iVar1 + 8);
    if (__ptr != (undefined8 *)0x0) {
      while (__ptr_00 = (void *)*__ptr, __ptr_00 != (void *)0x0) {
        *__ptr = *(undefined8 *)((long)__ptr_00 + 0x20);
        free(__ptr_00);
      }
      free(__ptr);
    }
    if (contents_only == 0) {
      free(sptr);
      return;
    }
  }
  return;
}

Assistant:

void
OCTET_STRING_free(asn_TYPE_descriptor_t *td, void *sptr, int contents_only) {
	OCTET_STRING_t *st = (OCTET_STRING_t *)sptr;
	asn_OCTET_STRING_specifics_t *specs;
	asn_struct_ctx_t *ctx;
	struct _stack *stck;

	if(!td || !st)
		return;

	specs = td->specifics
		    ? (asn_OCTET_STRING_specifics_t *)td->specifics
		    : &asn_DEF_OCTET_STRING_specs;
	ctx = (asn_struct_ctx_t *)((char *)st + specs->ctx_offset);

	ASN_DEBUG("Freeing %s as OCTET STRING", td->name);

	if(st->buf) {
		FREEMEM(st->buf);
		st->buf = 0;
	}

	/*
	 * Remove decode-time stack.
	 */
	stck = (struct _stack *)ctx->ptr;
	if(stck) {
		while(stck->tail) {
			struct _stack_el *sel = stck->tail;
			stck->tail = sel->prev;
			FREEMEM(sel);
		}
		FREEMEM(stck);
	}

	if(!contents_only) {
		FREEMEM(st);
	}
}